

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzclose.c
# Opt level: O2

int gzclose(gzFile file)

{
  int iVar1;
  
  if (file == (gzFile)0x0) {
    return -2;
  }
  if (*file != 0x1c4f) {
    iVar1 = gzclose_w(file);
    return iVar1;
  }
  iVar1 = -2;
  if ((file != (gzFile)0x0) && (*file == 0x1c4f)) {
    if (*(int *)((long)file + 0x18) != 0) {
      inflateEnd((z_streamp)((long)file + 0x78));
      free(*(void **)((long)file + 0x28));
      free(*(void **)((long)file + 0x20));
    }
    gz_error((gz_statep)file,0,(char *)0x0);
    free(*(void **)((long)file + 8));
    iVar1 = close(*(int *)((long)file + 4));
    free(file);
    iVar1 = -(uint)(iVar1 != 0);
  }
  return iVar1;
}

Assistant:

ZEXPORT gzclose(gzFile file)
{
#ifndef NO_GZCOMPRESS
    gz_statep state;

    if (file == NULL)
        return Z_STREAM_ERROR;
    state = (gz_statep)file;

    return state->mode == GZ_READ ? gzclose_r(file) : gzclose_w(file);
#else
    return gzclose_r(file);
#endif
}